

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftmgr.c
# Opt level: O0

int ftmgr_aeq_handle(ftmgr *ftmgr,uint8_t aeq,uint8_t *offset)

{
  bool bVar1;
  uint8_t *offset_local;
  uint8_t aeq_local;
  ftmgr *ftmgr_local;
  
  if ((((uint)ftmgr->bitmap & 1 << (aeq & 0x1f)) == 0) &&
     (*(int *)ftmgr->ftq[aeq].blk == *(int *)offset)) {
    ftmgr->tts = ftmgr->tts + -1;
    ftmgr->bitmap = ftmgr->bitmap | (byte)(1 << (aeq & 0x1f));
    progress(&ftmgr->pr,(long)(int)(ftmgr->ftq[aeq].size - 4),"send");
    ftmgr_fill(ftmgr);
    ftmgr_timedout(ftmgr);
  }
  else if ((*(int *)ftmgr->ftq[aeq].blk != *(int *)offset) && ((loglevel & 1U) != 0)) {
    syslog(3,"packted resend seq = %02x\n",(ulong)aeq);
  }
  bVar1 = ftmgr->bitmap != 0xff;
  if (!bVar1) {
    fm_write(ftmgr->chmgr,0x82,(void *)0x0,0);
  }
  ftmgr_local._4_4_ = (uint)bVar1;
  return ftmgr_local._4_4_;
}

Assistant:

int ftmgr_aeq_handle(struct ftmgr *ftmgr, uint8_t aeq, const uint8_t offset[4])
{
    if(!(ftmgr->bitmap & (1 << aeq)) && !memcmp(ftmgr->ftq[aeq].blk, offset, 4)) {
        ftmgr->tts--;
        ftmgr->bitmap |= (1 << aeq);
        progress(&ftmgr->pr, ftmgr->ftq[aeq].size - BLK_HDR_SIZE, "send");
        ftmgr_fill(ftmgr);
        ftmgr_timedout(ftmgr);
    } else if(memcmp(ftmgr->ftq[aeq].blk, offset, 4)) {
        LOGE("packted resend seq = %02x\n", aeq);
    }

    if(ftmgr->bitmap == (__typeof__(ftmgr->bitmap))-1) {
        fm_write(ftmgr->chmgr, CTRL_BLK_COMP, NULL, 0);
        return 0;
    }
    return 1;
}